

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
kj::
newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          (void)

{
  WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *pWVar1
  ;
  PromiseNode *pPVar2;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *in_RDI;
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  wrapper;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  pWVar1 = (WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            *)operator_new(0x18);
  (pWVar1->
  super_PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  )._vptr_PromiseFulfiller = (_func_int **)&PTR_fulfill_0042b750;
  (pWVar1->super_Disposer)._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0042b780;
  pWVar1->inner =
       (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
        *)0x0;
  wrapper.disposer = &pWVar1->super_Disposer;
  wrapper.ptr = pWVar1;
  pPVar2 = (PromiseNode *)operator_new(0x1a0);
  pPVar2[1]._vptr_PromiseNode = (_func_int **)0x0;
  pPVar2->_vptr_PromiseNode = (_func_int **)&PTR_onReady_0042b7e0;
  pPVar2[2]._vptr_PromiseNode = (_func_int **)&PTR_fulfill_0042b828;
  *(undefined1 *)&pPVar2[3]._vptr_PromiseNode = 0;
  *(undefined1 *)&pPVar2[0x2f]._vptr_PromiseNode = 0;
  *(undefined1 *)&pPVar2[0x31]._vptr_PromiseNode = 1;
  pPVar2[0x32]._vptr_PromiseNode = (_func_int **)(pPVar2 + 2);
  pPVar2[0x33]._vptr_PromiseNode = (_func_int **)pWVar1;
  pWVar1->inner =
       (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
        *)(pPVar2 + 2);
  local_38.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>>
        ::instance;
  local_38.ptr = (PromiseNode *)0x0;
  local_28.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>>
        ::instance;
  (in_RDI->promise).super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>>
        ::instance;
  (in_RDI->promise).super_PromiseBase.node.ptr = pPVar2;
  local_28.ptr = (PromiseNode *)0x0;
  (in_RDI->fulfiller).disposer = &pWVar1->super_Disposer;
  (in_RDI->fulfiller).ptr =
       (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
        *)pWVar1;
  wrapper.ptr = (WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                 *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  ::~Own(&wrapper);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}